

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O0

void __thiscall QMenu::hideEvent(QMenu *this,QHideEvent *param_2)

{
  bool bVar1;
  QMenuPrivate *pQVar2;
  QMenuBar *pQVar3;
  QObject *in_RDI;
  long in_FS_OFFSET;
  QMenuPrivate *unaff_retaddr;
  QMenuBar *mb;
  QMenuPrivate *d;
  QAccessibleEvent event;
  QAction *in_stack_00000048;
  QAction *in_stack_00000058;
  QMenuPrivate *in_stack_ffffffffffffffa8;
  undefined1 *local_28;
  QMenuPrivate *this_00;
  undefined2 uVar4;
  undefined8 in_stack_fffffffffffffff0;
  undefined1 activateFirst;
  QMenuBarPrivate *this_01;
  long lVar5;
  
  activateFirst = (undefined1)((ulong)in_stack_fffffffffffffff0 >> 0x38);
  lVar5 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QMenu *)0x649b3f);
  aboutToHide((QMenu *)0x649b4e);
  if (pQVar2->eventLoop != (QEventLoop *)0x0) {
    QEventLoop::exit((int)pQVar2->eventLoop);
  }
  QMenuPrivate::setCurrentAction
            (unaff_retaddr,in_stack_00000048,(int)((ulong)lVar5 >> 0x20),(SelectionReason)lVar5,
             (bool)activateFirst);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  this_00 = (QMenuPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  uVar4 = 0xaaaa;
  this_01 = (QMenuBarPrivate *)&DAT_aaaaaaaaaaaaaaaa;
  QAccessibleEvent::QAccessibleEvent((QAccessibleEvent *)&local_28,in_RDI,PopupMenuEnd);
  QAccessible::updateAccessibility((QAccessibleEvent *)&local_28);
  ::QPointer::operator_cast_to_QWidget_((QPointer<QWidget> *)0x649bea);
  pQVar3 = qobject_cast<QMenuBar*>((QObject *)0x649bf2);
  if (pQVar3 != (QMenuBar *)0x0) {
    QMenuBar::d_func((QMenuBar *)0x649c09);
    QMenuBarPrivate::setCurrentAction
              (this_01,in_stack_00000058,SUB21((ushort)uVar4 >> 8,0),SUB21(uVar4,0));
  }
  if ((QObject *)QMenuPrivate::mouseDown == in_RDI) {
    QMenuPrivate::mouseDown = (QMenu *)0x0;
  }
  *(ushort *)&pQVar2->field_0x420 = *(ushort *)&pQVar2->field_0x420 & 0xff7f;
  bVar1 = ::QPointer::operator_cast_to_bool((QPointer<QMenu> *)0x649c5f);
  if (bVar1) {
    in_stack_ffffffffffffffa8 = pQVar2;
    ::QPointer::operator_cast_to_QMenu_((QPointer<QMenu> *)0x649c7f);
    QMenuPrivate::hideMenu(this_00,this);
  }
  QPointer<QWidget>::operator=((QPointer<QWidget> *)in_RDI,(QWidget *)in_stack_ffffffffffffffa8);
  QPointer<QAction>::operator=((QPointer<QAction> *)in_RDI,(QAction *)in_stack_ffffffffffffffa8);
  if (pQVar2->scroll != (QMenuScroller *)0x0) {
    QBasicTimer::stop();
  }
  QAccessibleEvent::~QAccessibleEvent((QAccessibleEvent *)&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar5) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QMenu::hideEvent(QHideEvent *)
{
    Q_D(QMenu);
    emit aboutToHide();
    if (d->eventLoop)
        d->eventLoop->exit();
    d->setCurrentAction(nullptr);
#if QT_CONFIG(accessibility)
    QAccessibleEvent event(this, QAccessible::PopupMenuEnd);
    QAccessible::updateAccessibility(&event);
#endif
#if QT_CONFIG(menubar)
    if (QMenuBar *mb = qobject_cast<QMenuBar*>(d->causedPopup.widget))
        mb->d_func()->setCurrentAction(nullptr);
#endif
    if (QMenuPrivate::mouseDown == this)
        QMenuPrivate::mouseDown = nullptr;
    d->hasHadMouse = false;
    if (d->activeMenu)
        d->hideMenu(d->activeMenu);
    d->causedPopup.widget = nullptr;
    d->causedPopup.action = nullptr;
    if (d->scroll)
        d->scroll->scrollTimer.stop(); //make sure the timer stops
}